

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

bool __thiscall
pdqsort_detail::
partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
          (pdqsort_detail *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_16_2_164db4ee comp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  HighsInt HVar4;
  HighsInt HVar5;
  ComponentData *pCVar6;
  pdqsort_detail *ppVar7;
  pdqsort_detail *ppVar8;
  long lVar9;
  pdqsort_detail *ppVar10;
  long local_58;
  ulong local_50;
  
  pCVar6 = comp.componentData;
  if ((this != (pdqsort_detail *)begin._M_current) &&
     (this + 4 != (pdqsort_detail *)begin._M_current)) {
    local_58 = 0;
    local_50 = 0;
    ppVar10 = this + 4;
    ppVar8 = this;
    do {
      ppVar7 = ppVar10;
      iVar1 = *(int *)ppVar8;
      HVar4 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         (pCVar6->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl.super__Vector_impl_data._M_finish[*(int *)(ppVar8 + 4)]);
      HVar5 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         (pCVar6->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl.super__Vector_impl_data._M_finish[iVar1]);
      iVar1 = *(int *)(*(long *)end._M_current + (long)HVar4 * 4);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar5 * 4);
      if ((iVar1 == 1) || (iVar2 != 1)) {
        if ((HVar4 < HVar5) && (iVar1 != 1 || iVar2 == 1)) goto LAB_002ff812;
      }
      else {
LAB_002ff812:
        iVar1 = *(int *)(ppVar8 + 4);
        *(int *)(ppVar8 + 4) = *(int *)ppVar8;
        ppVar10 = this;
        if (ppVar7 + -4 != this) {
          lVar9 = local_58;
          do {
            iVar2 = *(int *)(this + lVar9 + -4);
            HVar4 = HighsDisjointSets<false>::getSet
                              ((HighsDisjointSets<false> *)end._M_current,
                               (pCVar6->permComponentStarts).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish[iVar1]);
            HVar5 = HighsDisjointSets<false>::getSet
                              ((HighsDisjointSets<false> *)end._M_current,
                               (pCVar6->permComponentStarts).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish[iVar2]);
            iVar2 = *(int *)(*(long *)end._M_current + (long)HVar4 * 4);
            iVar3 = *(int *)(*(long *)end._M_current + (long)HVar5 * 4);
            if ((iVar2 == 1) || (iVar3 != 1)) {
              if ((HVar5 <= HVar4) || (iVar2 == 1 && iVar3 != 1)) {
                ppVar10 = this + lVar9;
                break;
              }
            }
            *(undefined4 *)(this + lVar9) = *(undefined4 *)(this + lVar9 + -4);
            lVar9 = lVar9 + -4;
          } while (lVar9 != 0);
        }
        *(int *)ppVar10 = iVar1;
        local_50 = local_50 + ((long)ppVar7 - (long)ppVar10 >> 2);
        if (8 < local_50) {
          return false;
        }
      }
      local_58 = local_58 + 4;
      ppVar10 = ppVar7 + 4;
      ppVar8 = ppVar7;
    } while (ppVar7 + 4 != (pdqsort_detail *)begin._M_current);
  }
  return true;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }